

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_YMW_Bank(VGMPlayer *this)

{
  byte bVar1;
  CHIP_DEVICE *pCVar2;
  UINT8 bankmask;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        (UINT8)((int)(this->_fileData[(ulong)this->_filePos + 1] & 0x80) >> 7));
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    bVar1 = this->_fileData[(ulong)this->_filePos + 1];
    if (((bVar1 & 3) == 3) && ((this->_fileData[(ulong)this->_filePos + 2] & 8) == 0)) {
      (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,'\x10',
                        this->_fileData[(ulong)this->_filePos + 2] / 0x10);
    }
    else {
      if ((bVar1 & 2) != 0) {
        (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,'\x11',
                          this->_fileData[(ulong)this->_filePos + 2] / 8);
      }
      if ((bVar1 & 1) != 0) {
        (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,'\x12',
                          this->_fileData[(ulong)this->_filePos + 2] / 8);
      }
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_YMW_Bank(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 bankmask = fData[0x01] & 0x03;
	// fData[0x03] is ignored as we don't support YMW258 ROMs > 16 MB
	if (bankmask == 0x03 && ! (fData[0x02] & 0x08))
	{
		// 1 MB banking (reg 0x10)
		cDev->write8(cDev->base.defInf.dataPtr, 0x10, fData[0x02] / 0x10);
	}
	else
	{
		// 512 KB banking (regs 0x11/0x12)
		if (bankmask & 0x02)	// low bank
			cDev->write8(cDev->base.defInf.dataPtr, 0x11, fData[0x02] / 0x08);
		if (bankmask & 0x01)	// high bank
			cDev->write8(cDev->base.defInf.dataPtr, 0x12, fData[0x02] / 0x08);
	}
	
	return;
}